

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O2

AggregateInitialiserList * __thiscall
soul::ModuleCloner::cloneInitialiserList(ModuleCloner *this,AggregateInitialiserList *old)

{
  pool_ref<soul::heart::Expression> *ppVar1;
  size_t sVar2;
  AggregateInitialiserList *pAVar3;
  long lVar4;
  pool_ref<soul::heart::Expression> local_38;
  
  pAVar3 = Module::
           allocate<soul::heart::AggregateInitialiserList,soul::CodeLocation_const&,soul::Type_const&>
                     (this->newModule,&(old->super_Expression).super_Object.location,&old->type);
  ppVar1 = (old->items).items;
  sVar2 = (old->items).numActive;
  for (lVar4 = 0; sVar2 << 3 != lVar4; lVar4 = lVar4 + 8) {
    local_38.object = cloneExpression(this,*(Expression **)((long)&ppVar1->object + lVar4));
    ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::push_back
              (&pAVar3->items,&local_38);
  }
  return pAVar3;
}

Assistant:

heart::AggregateInitialiserList& cloneInitialiserList (const heart::AggregateInitialiserList& old)
    {
        auto& l = newModule.allocate<heart::AggregateInitialiserList> (old.location, old.type);

        for (auto& i : old.items)
            l.items.push_back (cloneExpression (i));

        return l;
    }